

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CGL::Application::mouse_released(Application *this,e_mouse_button b)

{
  OfflineRenderer *pOVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  ostream *poVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_48 [16];
  double local_38;
  undefined1 auStack_28 [16];
  
  if (b == MIDDLE) {
    this->middleDown = false;
  }
  else if (b == RIGHT) {
    if (this->mode == RENDER_MODE) {
      auVar2._0_4_ = this->mouseX;
      auVar2._4_4_ = this->mouseY;
      auVar2[8] = this->leftDown;
      auVar2[9] = this->rightDown;
      auVar2[10] = this->middleDown;
      auVar2._11_5_ = *(undefined5 *)&this->field_0x383;
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)((float)this->screenH - this->mouseY)),0x10);
      vcvtps2pd_avx(auVar2);
      (*this->renderer->_vptr_OfflineRenderer[8])();
      (*this->renderer->_vptr_OfflineRenderer[6])();
      (*this->renderer->_vptr_OfflineRenderer[10])();
    }
    this->rightDown = false;
  }
  else if (((b == LEFT) && (this->leftDown = false, this->mode == RENDER_MODE)) &&
          (pOVar1 = this->renderer, pOVar1->render_cell == true)) {
    auVar8._0_8_ = this->screenW;
    auVar8._8_8_ = this->screenH;
    auVar2 = vpblendd_avx2(auVar8,(undefined1  [16])0x0,10);
    auVar10._8_8_ = 0x4330000000000000;
    auVar10._0_8_ = 0x4330000000000000;
    auVar2 = vpor_avx(auVar2,auVar10);
    auVar8 = vpsrlq_avx(auVar8,0x20);
    auVar11._8_8_ = 0x4530000000000000;
    auVar11._0_8_ = 0x4530000000000000;
    auVar8 = vpor_avx(auVar8,auVar11);
    auVar12._8_8_ = 0x4530000000100000;
    auVar12._0_8_ = 0x4530000000100000;
    auVar8 = vsubpd_avx(auVar8,auVar12);
    auVar5._0_8_ = (pOVar1->cell_tl).x;
    auVar5._8_8_ = (pOVar1->cell_tl).y;
    auVar5._16_8_ = (pOVar1->cell_br).x;
    auVar5._24_8_ = (pOVar1->cell_br).y;
    auVar3 = vpermpd_avx2(auVar5,0x4e);
    auVar3 = vcmppd_avx(auVar3,auVar5,1);
    auVar4 = vpermpd_avx2(auVar5,0xee);
    auVar5 = vpermpd_avx2(auVar5,0x44);
    auVar5 = vblendvpd_avx(auVar5,auVar4,auVar3);
    auVar9 = ZEXT1632(CONCAT88(auVar2._8_8_ + auVar8._8_8_,auVar2._0_8_ + auVar8._0_8_)) << 0x80;
    auVar3 = vcmppd_avx(auVar9,auVar5,1);
    auVar4 = vcmppd_avx(auVar5,auVar9,1);
    auVar2 = vpackssdw_avx(auVar3._0_16_,auVar4._16_16_);
    auVar3 = vpmovsxdq_avx2(auVar2);
    auVar5 = vblendvpd_avx(auVar9,auVar5,auVar3);
    (pOVar1->cell_tl).x = (double)SUB168(auVar5._0_16_,0);
    (pOVar1->cell_tl).y = (double)SUB168(auVar5._0_16_,8);
    (pOVar1->cell_br).x = (double)SUB168(auVar5._16_16_,0);
    (pOVar1->cell_br).y = (double)SUB168(auVar5._16_16_,8);
    poVar7 = std::operator<<((ostream *)&std::cout,"[renderer] Selected cell measures ");
    local_38 = auVar5._0_8_;
    auStack_28._0_8_ = auVar5._16_8_;
    uVar6 = auStack_28._0_8_;
    auStack_28 = auVar5._16_16_;
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)((double)uVar6 - local_38));
    poVar7 = std::operator<<(poVar7,"x");
    auVar2 = vsubpd_avx(local_48,auStack_28);
    auVar2 = vshufpd_avx(auVar2,auVar2,1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)auVar2._0_8_);
    poVar7 = std::operator<<(poVar7," pixels");
    std::endl<char,std::char_traits<char>>(poVar7);
    (*this->renderer->_vptr_OfflineRenderer[6])();
    (*this->renderer->_vptr_OfflineRenderer[10])();
    return;
  }
  return;
}

Assistant:

void Application::mouse_released(e_mouse_button b) {
  switch (b) {
    case LEFT:
      leftDown = false;
      if (mode == RENDER_MODE && renderer->render_cell) {
        Vector2D tl(max(0.,min(renderer->cell_tl.x,renderer->cell_br.x)),
                    max(0.,min(renderer->cell_tl.y,renderer->cell_br.y)));
        Vector2D br(min(screenW*1.,max(renderer->cell_tl.x,renderer->cell_br.x)),
                    min(screenH*1.,max(renderer->cell_tl.y,renderer->cell_br.y)));
        renderer->cell_tl = tl;
        renderer->cell_br = br;
        cout << "[renderer] Selected cell measures " << (int)(br.x-tl.x) << "x" << (int)(br.y-tl.y) << " pixels" << endl;
        renderer->stop();
        renderer->start_raytracing();
      }
      break;
    case RIGHT:
      if (mode == RENDER_MODE) {
        renderer->autofocus(Vector2D(mouseX, screenH - mouseY));
        renderer->stop();
        renderer->start_raytracing();
      }
      rightDown = false;
      break;
    case MIDDLE:
      middleDown = false;
      break;
  }
}